

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O0

void Sim_SolveTargetsUsingSat(Sim_Man_t *p,int Limit)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void *Entry;
  Abc_Ntk_t *pNtk;
  abctime aVar4;
  Fraig_Man_t *p_00;
  abctime aVar5;
  int *pModel_00;
  Sim_Pat_t *Entry_00;
  abctime clk;
  int Counter;
  int v;
  int k;
  int Input;
  int Output;
  int RetValue;
  int *pModel;
  void *pEntry;
  Sim_Pat_t *pPat;
  Abc_Ntk_t *pMiter;
  Abc_Obj_t *pNodeCi;
  Fraig_Man_t *pMan;
  Fraig_Params_t Params;
  int Limit_local;
  Sim_Man_t *p_local;
  
  clk._0_4_ = 0;
  p->nSatRuns = 0;
  v = 0;
  Params.nInspLimit._4_4_ = Limit;
  do {
    iVar1 = Vec_VecSize(p->vSuppTargs);
    if (iVar1 <= v) {
      return;
    }
    pVVar3 = Vec_VecEntry(p->vSuppTargs,v);
    Counter = Vec_PtrSize(pVVar3);
    while (Counter = Counter + -1, -1 < Counter) {
      pVVar3 = Vec_VecEntry(p->vSuppTargs,v);
      Entry = Vec_PtrEntry(pVVar3,Counter);
      p->nSatRuns = p->nSatRuns + 1;
      iVar1 = (int)Entry;
      pNtk = Abc_NtkMiterForCofactors(p->pNtk,iVar1,v,-1);
      Fraig_ParamsSetDefault((Fraig_Params_t *)&pMan);
      Params.nPatsDyna = 1000000000;
      Params.fVerbose = 1;
      aVar4 = Abc_Clock();
      p_00 = (Fraig_Man_t *)Abc_NtkToFraig(pNtk,&pMan,0,0);
      aVar5 = Abc_Clock();
      p->timeFraig = (aVar5 - aVar4) + p->timeFraig;
      aVar4 = Abc_Clock();
      Fraig_ManProveMiter(p_00);
      aVar5 = Abc_Clock();
      p->timeSat = (aVar5 - aVar4) + p->timeSat;
      iVar2 = Fraig_ManCheckMiter(p_00);
      if (iVar2 < 0) {
        __assert_fail("RetValue >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                      ,0x1e5,"void Sim_SolveTargetsUsingSat(Sim_Man_t *, int)");
      }
      if (iVar2 == 1) {
        p->nSatRunsUnsat = p->nSatRunsUnsat + 1;
        Vec_PtrRemove((Vec_Ptr_t *)p->vSuppTargs->pArray[v],Entry);
      }
      else {
        p->nSatRunsSat = p->nSatRunsSat + 1;
        pModel_00 = Fraig_ManReadModel(p_00);
        if (pModel_00 == (int *)0x0) {
          __assert_fail("pModel != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                        ,0x1f0,"void Sim_SolveTargetsUsingSat(Sim_Man_t *, int)");
        }
        iVar2 = Sim_SolveSuppModelVerify(p->pNtk,pModel_00,v,iVar1);
        if (iVar2 == 0) {
          __assert_fail("Sim_SolveSuppModelVerify( p->pNtk, pModel, Input, Output )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                        ,0x1f1,"void Sim_SolveTargetsUsingSat(Sim_Man_t *, int)");
        }
        Entry_00 = Sim_ManPatAlloc(p);
        Entry_00->Input = v;
        Entry_00->Output = iVar1;
        for (clk._4_4_ = 0; iVar1 = Abc_NtkCiNum(p->pNtk), clk._4_4_ < iVar1;
            clk._4_4_ = clk._4_4_ + 1) {
          Abc_NtkCi(p->pNtk,clk._4_4_);
          if (pModel_00[clk._4_4_] != 0) {
            Entry_00->pData[clk._4_4_ >> 5] =
                 1 << ((byte)clk._4_4_ & 0x1f) | Entry_00->pData[clk._4_4_ >> 5];
          }
        }
        Vec_PtrPush(p->vFifo,Entry_00);
        clk._0_4_ = (int)clk + 1;
      }
      Fraig_ManFree(p_00);
      Abc_NtkDelete(pNtk);
      p->iInput = v;
      if ((int)clk == 1) {
        return;
      }
    }
    v = v + 1;
  } while( true );
}

Assistant:

void Sim_SolveTargetsUsingSat( Sim_Man_t * p, int Limit )
{
    Fraig_Params_t Params;
    Fraig_Man_t * pMan;
    Abc_Obj_t * pNodeCi;
    Abc_Ntk_t * pMiter;
    Sim_Pat_t * pPat;
    void * pEntry;
    int * pModel;
    int RetValue, Output, Input, k, v;
    int Counter = 0;
    abctime clk;

    p->nSatRuns = 0;
    // put targets into one array
    Vec_VecForEachEntryReverse( void *, p->vSuppTargs, pEntry, Input, k )
    {
        p->nSatRuns++;
        Output = (int)(ABC_PTRUINT_T)pEntry;

        // set up the miter for the two cofactors of this output w.r.t. this input
        pMiter = Abc_NtkMiterForCofactors( p->pNtk, Output, Input, -1 );

        // transform the miter into a fraig
        Fraig_ParamsSetDefault( &Params );
        Params.nSeconds = ABC_INFINITY;
        Params.fInternal = 1;
clk = Abc_Clock();
        pMan = (Fraig_Man_t *)Abc_NtkToFraig( pMiter, &Params, 0, 0 ); 
p->timeFraig += Abc_Clock() - clk;
clk = Abc_Clock();
        Fraig_ManProveMiter( pMan );
p->timeSat += Abc_Clock() - clk;

        // analyze the result
        RetValue = Fraig_ManCheckMiter( pMan );
        assert( RetValue >= 0 );
        if ( RetValue == 1 ) // unsat
        {
            p->nSatRunsUnsat++;
            pModel = NULL;
            Vec_PtrRemove( (Vec_Ptr_t *)p->vSuppTargs->pArray[Input], pEntry );
        }
        else // sat
        {
            p->nSatRunsSat++;
            pModel = Fraig_ManReadModel( pMan );
            assert( pModel != NULL );
            assert( Sim_SolveSuppModelVerify( p->pNtk, pModel, Input, Output ) );

//printf( "Solved by SAT (%d,%d).\n", Input, Output );
            // set the new pattern
            pPat = Sim_ManPatAlloc( p );
            pPat->Input  = Input;
            pPat->Output = Output;
            Abc_NtkForEachCi( p->pNtk, pNodeCi, v )
                if ( pModel[v] )
                    Sim_SetBit( pPat->pData, v );
            Vec_PtrPush( p->vFifo, pPat );
/*
            // set the new pattern
            pPat = Sim_ManPatAlloc( p );
            pPat->Input  = Input;
            pPat->Output = Output;
            Abc_NtkForEachCi( p->pNtk, pNodeCi, v )
                if ( pModel[v] )
                    Sim_SetBit( pPat->pData, v );
            Sim_XorBit( pPat->pData, Input );  // add this bit in the opposite polarity
            Vec_PtrPush( p->vFifo, pPat );
*/
            Counter++;
        }
        // delete the fraig manager
        Fraig_ManFree( pMan );
        // delete the miter
        Abc_NtkDelete( pMiter );

        // makr the input, which we are processing
        p->iInput = Input;

        // stop when we found enough patterns
//        if ( Counter == Limit )
        if ( Counter == 1 )
            return;
    }
}